

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_add_slow(JSContext *ctx,JSValue *sp)

{
  JSValue v_00;
  JSValue val_00;
  int iVar1;
  int iVar2;
  long in_RSI;
  JSContext *in_RDI;
  double d;
  JSValue JVar3;
  JSValue JVar4;
  double d2;
  double d1;
  uint32_t tag2;
  uint32_t tag1;
  JSValue op2;
  JSValue op1;
  anon_union_8_2_94730072 t;
  anon_union_8_2_94730072 u;
  int32_t val;
  JSValue v;
  JSContext *in_stack_fffffffffffffef0;
  long lVar5;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  int64_t in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  double local_d8;
  JSContext *in_stack_ffffffffffffff30;
  JSValue in_stack_ffffffffffffff38;
  JSValue JVar6;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  JSValue in_stack_ffffffffffffffa8;
  undefined4 uStack_44;
  JSValueUnion local_10;
  int64_t local_8;
  
  iVar2 = (int)*(undefined8 *)(in_RSI + -0x18);
  iVar1 = (int)*(undefined8 *)(in_RSI + -8);
  if (((iVar2 != 0) && (iVar2 != 7)) || ((iVar1 != 0 && (iVar1 != 7)))) {
    JVar4 = JS_ToPrimitiveFree((JSContext *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffffa8,(int)((ulong)in_RDI >> 0x20));
    iVar2 = JS_IsException(JVar4);
    if (iVar2 != 0) {
      JVar4.u._4_4_ = in_stack_fffffffffffffefc;
      JVar4.u.int32 = in_stack_fffffffffffffef8;
      JVar4.tag = in_stack_ffffffffffffff00;
      JS_FreeValue(in_stack_fffffffffffffef0,JVar4);
      goto LAB_00161ca0;
    }
    JVar3 = JS_ToPrimitiveFree((JSContext *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffffa8,(int)((ulong)in_RDI >> 0x20));
    JVar6 = JVar3;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 != 0) {
      JVar6.u._4_4_ = in_stack_fffffffffffffefc;
      JVar6.u.int32 = in_stack_fffffffffffffef8;
      JVar6.tag = in_stack_ffffffffffffff00;
      JS_FreeValue(in_stack_fffffffffffffef0,JVar6);
      goto LAB_00161ca0;
    }
    if (((int)JVar4.tag == -7) || ((int)JVar3.tag == -7)) {
      lVar5 = in_RSI;
      JVar4 = JS_ConcatString(in_stack_ffffffffffffff30,JVar6,in_stack_ffffffffffffff38);
      *(JSValueUnion *)(lVar5 + -0x20) = JVar4.u;
      *(int64_t *)(lVar5 + -0x18) = JVar4.tag;
      iVar2 = JS_IsException(*(JSValue *)(in_RSI + -0x20));
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00161ca0;
    }
  }
  JVar3.tag._0_4_ = in_stack_ffffffffffffff08;
  JVar3.u.ptr = (void *)in_stack_ffffffffffffff00;
  JVar3.tag._4_4_ = in_stack_ffffffffffffff0c;
  iVar2 = JS_ToFloat64Free((JSContext *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (double *)in_stack_fffffffffffffef0,JVar3);
  if (iVar2 == 0) {
    val_00.tag._0_4_ = in_stack_ffffffffffffff08;
    val_00.u.ptr = (void *)in_stack_ffffffffffffff00;
    val_00.tag._4_4_ = in_stack_ffffffffffffff0c;
    iVar2 = JS_ToFloat64Free((JSContext *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                             (double *)in_stack_fffffffffffffef0,val_00);
    if (iVar2 == 0) {
      d = (double)in_stack_ffffffffffffff30 + local_d8;
      if (d == (double)(int)d) {
        local_10._4_4_ = uStack_44;
        local_10.int32 = (int)d;
        local_8 = 0;
      }
      else {
        JVar4 = __JS_NewFloat64(in_RDI,d);
        local_10 = JVar4.u;
        local_8 = JVar4.tag;
      }
      *(JSValueUnion *)(in_RSI + -0x20) = local_10;
      *(int64_t *)(in_RSI + -0x18) = local_8;
      return 0;
    }
  }
  else {
    v_00.u._4_4_ = in_stack_fffffffffffffefc;
    v_00.u.int32 = in_stack_fffffffffffffef8;
    v_00.tag = in_stack_ffffffffffffff00;
    JS_FreeValue(in_stack_fffffffffffffef0,v_00);
  }
LAB_00161ca0:
  *(ulong *)(in_RSI + -0x20) = (ulong)in_stack_ffffffffffffff0c << 0x20;
  *(undefined8 *)(in_RSI + -0x18) = 3;
  *(ulong *)(in_RSI + -0x10) = (ulong)in_stack_fffffffffffffefc << 0x20;
  *(undefined8 *)(in_RSI + -8) = 3;
  return -1;
}

Assistant:

int js_add_slow(JSContext *ctx, JSValue *sp)
{
    JSValue op1, op2;
    uint32_t tag1, tag2;

    op1 = sp[-2];
    op2 = sp[-1];
    tag1 = JS_VALUE_GET_TAG(op1);
    tag2 = JS_VALUE_GET_TAG(op2);
    if ((tag1 == JS_TAG_INT || JS_TAG_IS_FLOAT64(tag1)) &&
        (tag2 == JS_TAG_INT || JS_TAG_IS_FLOAT64(tag2))) {
        goto add_numbers;
    } else {
        op1 = JS_ToPrimitiveFree(ctx, op1, HINT_NONE);
        if (JS_IsException(op1)) {
            JS_FreeValue(ctx, op2);
            goto exception;
        }
        op2 = JS_ToPrimitiveFree(ctx, op2, HINT_NONE);
        if (JS_IsException(op2)) {
            JS_FreeValue(ctx, op1);
            goto exception;
        }
        tag1 = JS_VALUE_GET_TAG(op1);
        tag2 = JS_VALUE_GET_TAG(op2);
        if (tag1 == JS_TAG_STRING || tag2 == JS_TAG_STRING) {
            sp[-2] = JS_ConcatString(ctx, op1, op2);
            if (JS_IsException(sp[-2]))
                goto exception;
        } else {
            double d1, d2;
        add_numbers:
            if (JS_ToFloat64Free(ctx, &d1, op1)) {
                JS_FreeValue(ctx, op2);
                goto exception;
            }
            if (JS_ToFloat64Free(ctx, &d2, op2))
                goto exception;
            sp[-2] = JS_NewFloat64(ctx, d1 + d2);
        }
    }
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}